

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

RangeValue __thiscall CoreML::RangeValue::operator+(RangeValue *this,size_t other)

{
  RangeValue *extraout_RAX;
  RangeValue RVar1;
  size_t other_local;
  RangeValue *this_local;
  RangeValue retval;
  
  RangeValue((RangeValue *)&this_local);
  if ((this->_isUnbound & 1U) == 0) {
    set((RangeValue *)&this_local,this->_val + other);
    this = extraout_RAX;
  }
  RVar1._1_7_ = (undefined7)((ulong)this >> 8);
  RVar1._isUnbound = (bool)this_local._0_1_;
  RVar1._val = retval._0_8_;
  return RVar1;
}

Assistant:

RangeValue RangeValue::operator+ (size_t other) const {
    RangeValue retval;
    if (!_isUnbound)
        retval.set(_val + other);
    return retval;
}